

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver-c.cc
# Opt level: O3

int NLW2_SolveFeederHandler_C
              (NLW2_NLSolver_C *pnls,NLW2_NLFeeder_C *nlf_c,NLW2_SOLHandler_C *solh_c,char *solver,
              char *solver_opts)

{
  NLSolver *this;
  bool bVar1;
  uint uVar2;
  long lVar3;
  NLW2_SOLHandler_C_Impl *pNVar4;
  byte bVar5;
  NLW2_SOLHandler_C_Impl solh;
  NLW2_NLFeeder_C_Impl nlf;
  allocator<char> local_19a;
  allocator<char> local_199;
  string local_198;
  string local_178;
  NLW2_SOLHandler_C_Impl local_158;
  NLW2_NLFeeder_C_Impl local_108;
  
  bVar5 = 0;
  memcpy(&local_108,nlf_c,0xe0);
  pNVar4 = &local_158;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pNVar4->solh2_c_).p_user_data_ = solh_c->p_user_data_;
    solh_c = (NLW2_SOLHandler_C *)((long)solh_c + (ulong)bVar5 * -0x10 + 8);
    pNVar4 = (NLW2_SOLHandler_C_Impl *)((long)pNVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  bVar1 = mp::NLSolver::LoadModel<mp::NLW2_NLFeeder_C_Impl>((NLSolver *)pnls->p_nlsol_,&local_108);
  uVar2 = 0;
  if (bVar1) {
    this = (NLSolver *)pnls->p_nlsol_;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,solver,&local_199);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,solver_opts,&local_19a);
    bVar1 = mp::NLSolver::Solve(this,&local_178,&local_198);
    if (bVar1) {
      bVar1 = mp::NLSolver::ReadSolution<mp::NLW2_SOLHandler_C_Impl>
                        ((NLSolver *)pnls->p_nlsol_,&local_158);
      uVar2 = (uint)bVar1;
    }
    else {
      uVar2 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
  }
  return uVar2;
}

Assistant:

int NLW2_SolveFeederHandler_C(NLW2_NLSolver_C* pnls,
                              NLW2_NLFeeder_C* nlf_c,
                              NLW2_SOLHandler_C* solh_c,
                              const char* solver,
                              const char* solver_opts) {
  mp::NLW2_NLFeeder_C_Impl nlf(nlf_c);
  mp::NLW2_SOLHandler_C_Impl solh(solh_c);
  return ((mp::NLSOL_C_Impl*)(pnls->p_nlsol_))
      ->LoadModel(nlf)
      && ((mp::NLSOL_C_Impl*)(pnls->p_nlsol_))
      ->Solve(solver, solver_opts)
      && ((mp::NLSOL_C_Impl*)(pnls->p_nlsol_))
      ->ReadSolution(solh);
}